

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O0

void __thiscall CppUnit::TestPath::insert(TestPath *this,Test *test,int index)

{
  int iVar1;
  out_of_range *this_00;
  iterator local_b0;
  iterator local_90;
  _Self local_70;
  const_iterator local_50;
  int local_1c;
  Test *pTStack_18;
  int index_local;
  Test *test_local;
  TestPath *this_local;
  
  local_1c = index;
  pTStack_18 = test;
  test_local = (Test *)this;
  if (-1 < index) {
    iVar1 = (*this->_vptr_TestPath[10])();
    if (index <= iVar1) {
      std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::begin(&local_90,&this->m_tests)
      ;
      std::operator+(&local_70,&local_90,(long)local_1c);
      std::_Deque_iterator<CppUnit::Test*,CppUnit::Test*const&,CppUnit::Test*const*>::
      _Deque_iterator<std::_Deque_iterator<CppUnit::Test*,CppUnit::Test*&,CppUnit::Test**>,void>
                ((_Deque_iterator<CppUnit::Test*,CppUnit::Test*const&,CppUnit::Test*const*> *)
                 &local_50,&local_70);
      std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::insert
                (&local_b0,&this->m_tests,&local_50,&stack0xffffffffffffffe8);
      return;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"TestPath::insert(): index out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void 
TestPath::insert( Test *test, 
                  int index )
{
  if ( index < 0  ||  index > getTestCount() )
    throw std::out_of_range( "TestPath::insert(): index out of range" );
  m_tests.insert( m_tests.begin() + index, test );
}